

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectbox.hpp
# Opt level: O3

void obx::internal::throwIllegalStateException(char *text1,char *text2)

{
  runtime_error *this;
  string msg;
  allocator local_31;
  string local_30 [32];
  
  std::__cxx11::string::string(local_30,text1,&local_31);
  if (text2 != (char *)0x0) {
    std::__cxx11::string::append((char *)local_30);
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,local_30);
  *(undefined ***)this = &PTR__runtime_error_00112b18;
  __cxa_throw(this,&IllegalStateException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

[[noreturn]] void throwIllegalStateException(const char* text1, const char* text2) {
    std::string msg(text1);
    if (text2) msg.append(text2);
    throw IllegalStateException(msg);
}